

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha384-512.c
# Opt level: O3

int SHA512FinalBits(SHA512Context *context,uint8_t message_bits,uint length)

{
  uint64_t *puVar1;
  ulong uVar2;
  ulong uVar3;
  uint uVar4;
  int iVar5;
  
  if (length == 0) {
    iVar5 = 0;
  }
  else if (context == (SHA512Context *)0x0) {
    iVar5 = 1;
  }
  else if ((length < 8) && (context->Computed == 0)) {
    iVar5 = context->Corrupted;
    if (iVar5 == 0) {
      uVar3 = (ulong)length;
      iVar5 = 0;
      puVar1 = &context->Length_Low;
      uVar2 = *puVar1;
      *puVar1 = *puVar1 + uVar3;
      uVar4 = 0;
      if (CARRY8(uVar2,uVar3)) {
        puVar1 = &context->Length_High;
        *puVar1 = *puVar1 + 1;
        uVar4 = (uint)(*puVar1 == 0);
      }
      context->Corrupted = uVar4;
      SHA384_512Finalize(context,message_bits & (&DAT_0018fe80)[uVar3] | (&DAT_0018fe88)[uVar3]);
    }
  }
  else {
    context->Corrupted = 3;
    iVar5 = 3;
  }
  return iVar5;
}

Assistant:

int SHA512FinalBits(SHA512Context *context,
    const uint8_t message_bits, unsigned int length)
{
    uint64_t addTemp;
    uint8_t masks[8] = {
        /* 0 0b00000000 */ 0x00, /* 1 0b10000000 */ 0x80,
        /* 2 0b11000000 */ 0xC0, /* 3 0b11100000 */ 0xE0,
        /* 4 0b11110000 */ 0xF0, /* 5 0b11111000 */ 0xF8,
        /* 6 0b11111100 */ 0xFC, /* 7 0b11111110 */ 0xFE
    };
    uint8_t markbit[8] = {
        /* 0 0b10000000 */ 0x80, /* 1 0b01000000 */ 0x40,
        /* 2 0b00100000 */ 0x20, /* 3 0b00010000 */ 0x10,
        /* 4 0b00001000 */ 0x08, /* 5 0b00000100 */ 0x04,
        /* 6 0b00000010 */ 0x02, /* 7 0b00000001 */ 0x01
    };

    if (!length)
        return shaSuccess;

    if (!context)
        return shaNull;

    if ((context->Computed) || (length >= 8) || (length == 0)) {
        context->Corrupted = shaStateError;
        return shaStateError;
    }

    if (context->Corrupted)
        return context->Corrupted;

    SHA384_512AddLength(context, length);
    SHA384_512Finalize(context, (uint8_t)
        ((message_bits & masks[length]) | markbit[length]));

    return shaSuccess;
}